

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write_direct
          (xml_buffered_writer *this,char_t *data,size_t length)

{
  xml_encoding xVar1;
  xml_encoding xVar2;
  size_t size;
  size_t chunk_size;
  size_t length_local;
  char_t *data_local;
  xml_buffered_writer *this_local;
  
  flush(this);
  chunk_size = length;
  length_local = (size_t)data;
  if (0x800 < length) {
    xVar1 = this->encoding;
    xVar2 = get_write_native_encoding();
    if (xVar1 == xVar2) {
      (*this->writer->_vptr_xml_writer[2])(this->writer,data,length);
      return;
    }
    for (; 0x800 < chunk_size; chunk_size = chunk_size - size) {
      size = get_valid_length((char_t *)length_local,0x800);
      if (size == 0) {
        __assert_fail("chunk_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/pugixml/src/pugixml.cpp"
                      ,0xea5,
                      "void pugi::impl::(anonymous namespace)::xml_buffered_writer::write_direct(const char_t *, size_t)"
                     );
      }
      flush(this,(char_t *)length_local,size);
      length_local = size + length_local;
    }
    this->bufsize = 0;
  }
  memcpy(this->buffer + this->bufsize,(void *)length_local,chunk_size);
  this->bufsize = chunk_size + this->bufsize;
  return;
}

Assistant:

void write_direct(const char_t* data, size_t length)
		{
			// flush the remaining buffer contents
			flush();

			// handle large chunks
			if (length > bufcapacity)
			{
				if (encoding == get_write_native_encoding())
				{
					// fast path, can just write data chunk
					writer.write(data, length * sizeof(char_t));
					return;
				}

				// need to convert in suitable chunks
				while (length > bufcapacity)
				{
					// get chunk size by selecting such number of characters that are guaranteed to fit into scratch buffer
					// and form a complete codepoint sequence (i.e. discard start of last codepoint if necessary)
					size_t chunk_size = get_valid_length(data, bufcapacity);
					assert(chunk_size);

					// convert chunk and write
					flush(data, chunk_size);

					// iterate
					data += chunk_size;
					length -= chunk_size;
				}

				// small tail is copied below
				bufsize = 0;
			}

			memcpy(buffer + bufsize, data, length * sizeof(char_t));
			bufsize += length;
		}